

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall
vkt::sr::ShaderRenderCaseInstance::uploadSparseImage
          (ShaderRenderCaseInstance *this,TextureFormat *texFormat,TextureData *textureData,
          Sampler *refSampler,deUint32 mipLevels,deUint32 arrayLayers,VkImage sparseImage,
          VkImageCreateInfo *imageCreateInfo,UVec3 texSize)

{
  uint uVar1;
  deUint32 dVar2;
  uint uVar3;
  VkDeviceSize VVar4;
  VkDeviceSize VVar5;
  VkDeviceSize VVar6;
  Allocator *pAVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  VkDeviceSize VVar12;
  bool bVar13;
  deUint32 dVar14;
  deUint32 dVar15;
  int iVar16;
  deUint32 dVar17;
  int iVar18;
  int iVar19;
  VkResult VVar20;
  VkDevice device;
  DeviceInterface *vk;
  VkPhysicalDevice physicalDevice;
  VkQueue pVVar21;
  InstanceInterface *vk_00;
  NotSupportedError *pNVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  deUint32 mipLevel;
  deUint32 y;
  uint uVar28;
  pointer pvVar29;
  deUint32 x;
  uint uVar30;
  TextureFormat *format;
  ConstPixelBufferAccess *access;
  pointer this_00;
  ulong uVar31;
  long lVar32;
  VkExtent3D VVar33;
  Move<vk::VkCommandBuffer_s_*> cmdBuffer;
  VkSparseMemoryBind imageMipTailMemoryBind;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> bufferAlloc;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> copyRegions;
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  sparseImageMemoryRequirements;
  VkCommandPool VStack_750;
  VkSubmitInfo submitInfo;
  Move<vk::Handle<(vk::HandleType)6>_> fence;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsetMultiples;
  VkPipelineStageFlags pipelineStageFlags;
  vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
  imageResidencyMemoryBinds;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_5c8;
  VkBufferCreateInfo bufferParams;
  VkPhysicalDeviceMemoryProperties deviceMemoryProperties;
  VkPhysicalDeviceProperties deviceProperties;
  
  device = getDevice(this);
  vk = getDeviceInterface(this);
  physicalDevice = getPhysicalDevice(this);
  pVVar21 = getUniversalQueue(this);
  dVar14 = getUniversalQueueFamilyIndex(this);
  vk_00 = getInstanceInterface(this);
  ::vk::getPhysicalDeviceProperties(&deviceProperties,vk_00,physicalDevice);
  ::vk::getPhysicalDeviceMemoryProperties(&deviceMemoryProperties,vk_00,physicalDevice);
  dVar15 = 2 - (refSampler->compare == COMPAREMODE_NONE);
  ::vk::createSemaphore
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&imageMipTailMemoryBind,vk,device,0,
             (VkAllocationCallbacks *)0x0);
  local_5c8.m_data.deleter.m_device = (VkDevice)imageMipTailMemoryBind.memory.m_internal;
  local_5c8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)imageMipTailMemoryBind.memoryOffset;
  local_5c8.m_data.object.m_internal = imageMipTailMemoryBind.resourceOffset;
  local_5c8.m_data.deleter.m_deviceIface = (DeviceInterface *)imageMipTailMemoryBind.size;
  imageMipTailMemoryBind.resourceOffset = 0;
  imageMipTailMemoryBind.size = 0;
  imageMipTailMemoryBind.memory.m_internal = 0;
  imageMipTailMemoryBind.memoryOffset = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)4>_> *)&imageMipTailMemoryBind);
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imageMipTailMemoryBind.resourceOffset = CONCAT44(imageMipTailMemoryBind.resourceOffset._4_4_,4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&offsetMultiples,(uint *)&imageMipTailMemoryBind);
  iVar16 = tcu::TextureFormat::getPixelSize(texFormat);
  imageMipTailMemoryBind.resourceOffset =
       CONCAT44(imageMipTailMemoryBind.resourceOffset._4_4_,iVar16);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&offsetMultiples,(uint *)&imageMipTailMemoryBind);
  bVar13 = isImageSizeSupported
                     (imageCreateInfo->imageType,(UVec3 *)texSize.m_data._0_8_,
                      &deviceProperties.limits);
  if (!bVar13) {
    pNVar22 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar22,"Image size not supported for device.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x59b);
    __cxa_throw(pNVar22,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  dVar17 = 0;
  for (pvVar29 = (textureData->
                 super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pvVar29 !=
      (textureData->
      super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; pvVar29 = pvVar29 + 1) {
    for (this_00 = (pvVar29->
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        this_00 !=
        (pvVar29->
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        )._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      dVar17 = sr::anon_unknown_0::getNextMultiple(&offsetMultiples,dVar17);
      iVar16 = (this_00->m_size).m_data[0];
      iVar26 = (this_00->m_size).m_data[1];
      iVar19 = (this_00->m_size).m_data[2];
      iVar18 = tcu::TextureFormat::getPixelSize(&this_00->m_format);
      dVar17 = iVar19 * iVar18 * iVar26 * iVar16 + dVar17;
    }
  }
  bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr._0_4_
       = 0;
  (*vk->_vptr_DeviceInterface[0x10])(vk,device,sparseImage.m_internal,&bufferAlloc,0);
  sparseImageMemoryRequirements.
  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sparseImageMemoryRequirements.
  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sparseImageMemoryRequirements.
  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ::resize(&sparseImageMemoryRequirements,
           (ulong)(uint)bufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .ptr);
  (*vk->_vptr_DeviceInterface[0x10])
            (vk,device,sparseImage.m_internal,&bufferAlloc,
             sparseImageMemoryRequirements.
             super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
             ._M_impl.super__Vector_impl_data._M_start);
  uVar31 = 0;
  do {
    uVar25 = uVar31;
    if ((uint)bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.ptr == (uint)uVar25) {
      pNVar22 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar22,
                 "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                 ,0x5c2);
      __cxa_throw(pNVar22,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    uVar31 = (ulong)((uint)uVar25 + 1);
  } while ((sparseImageMemoryRequirements.
            super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar25].formatProperties.aspectMask & 1) == 0)
  ;
  ::vk::getImageMemoryRequirements((VkMemoryRequirements *)&submitInfo,vk,device,sparseImage);
  uVar31 = 0;
  do {
    if (deviceMemoryProperties.memoryTypeCount <= uVar31) {
      pNVar22 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar22,"No matching memory type found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                 ,0x5d2);
LAB_00635600:
      __cxa_throw(pNVar22,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if (((submitInfo.waitSemaphoreCount >> ((uint)uVar31 & 0x1f) & 1) != 0) &&
       (bVar13 = ::vk::MemoryRequirement::matchesHeap
                           ((MemoryRequirement *)&::vk::MemoryRequirement::Any,
                            deviceMemoryProperties.memoryTypes[uVar31].propertyFlags), bVar13)) {
      if ((ulong)submitInfo._0_8_ <= deviceProperties.limits.sparseAddressSpaceSize) {
        ::vk::getPhysicalDeviceSparseImageFormatProperties
                  ((vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
                    *)&bufferParams,vk_00,physicalDevice,imageCreateInfo->format,
                   imageCreateInfo->imageType,imageCreateInfo->samples,imageCreateInfo->usage,
                   imageCreateInfo->tiling);
        if (bufferParams.pNext == (void *)CONCAT44(bufferParams._4_4_,bufferParams.sType)) {
          pNVar22 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar22,"The image format does not support sparse operations.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                     ,0x5dc);
          __cxa_throw(pNVar22,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        uVar1 = sparseImageMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar25].formatProperties.flags;
        dVar2 = sparseImageMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar25].imageMipTailFirstLod;
        VVar4 = sparseImageMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar25].imageMipTailSize;
        VVar5 = sparseImageMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar25].imageMipTailOffset;
        VVar6 = sparseImageMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar25].imageMipTailStride;
        uVar3 = sparseImageMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar25].formatProperties.imageGranularity.
                depth;
        uVar31._0_4_ = sparseImageMemoryRequirements.
                       super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].formatProperties.
                       imageGranularity.width;
        uVar31._4_4_ = sparseImageMemoryRequirements.
                       super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].formatProperties.
                       imageGranularity.height;
        imageResidencyMemoryBinds.
        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        imageResidencyMemoryBinds.
        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        imageResidencyMemoryBinds.
        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device = (VkDevice)0x0;
        fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
        fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = uVar31;
        buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface._0_4_ =
             uVar3;
        for (uVar25 = 0; uVar25 != arrayLayers; uVar25 = uVar25 + 1) {
          for (mipLevel = 0; mipLevel != dVar2; mipLevel = mipLevel + 1) {
            VVar33 = mipLevelExtents(&imageCreateInfo->extent,mipLevel);
            cmdBufferBeginInfo._0_12_ = VVar33;
            alignedDivide((sr *)&copyRegions,(VkExtent3D *)&cmdBufferBeginInfo,(VkExtent3D *)&buffer
                         );
            uVar27 = 0;
            iVar16 = (int)((VVar33._0_8_ & 0xffffffff) % (uVar31 & 0xffffffff));
            if (iVar16 == 0) {
              iVar16 = (undefined4)uVar31;
            }
            uVar23 = (uint)((VVar33._0_8_ >> 0x20) % (ulong)(uint)uVar31._4_4_);
            if (uVar23 == 0) {
              uVar23 = uVar31._4_4_;
            }
            uVar24 = VVar33.depth % uVar3;
            if (uVar24 == 0) {
              uVar24 = uVar3;
            }
            for (; uVar27 < (uint)copyRegions.
                                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                  ._M_impl.super__Vector_impl_data._M_finish; uVar27 = uVar27 + 1) {
              for (uVar28 = 0;
                  uVar28 < copyRegions.
                           super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_; uVar28 = uVar28 + 1) {
                iVar26 = 0;
                uVar30 = 0;
                while( true ) {
                  if ((uint)copyRegions.
                            super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                            ._M_impl.super__Vector_impl_data._M_start <= uVar30) break;
                  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
                       (deUint64)submitInfo.pNext;
                  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                  m_deviceIface = (DeviceInterface *)submitInfo.pNext;
                  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
                       (VkDevice)
                       CONCAT44(cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                                deleter.m_device._4_4_,submitInfo.waitSemaphoreCount);
                  (*this->m_memAlloc->_vptr_Allocator[3])
                            (&imageMipTailMemoryBind,this->m_memAlloc,&cmdPool,0);
                  VVar12 = imageMipTailMemoryBind.resourceOffset;
                  imageMipTailMemoryBind.resourceOffset = 0;
                  de::SharedPtr<vk::Allocation>::SharedPtr
                            ((SharedPtr<vk::Allocation> *)&cmdBuffer,(Allocation *)VVar12);
                  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
                  ~UniqueBase((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                              &imageMipTailMemoryBind);
                  std::
                  vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                  ::push_back(&this->m_allocations,(SharedPtr<vk::Allocation> *)&cmdBuffer);
                  iVar19 = (undefined4)uVar31;
                  if (uVar30 == (uint)copyRegions.
                                      super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                      ._M_impl.super__Vector_impl_data._M_start - 1) {
                    iVar19 = iVar16;
                  }
                  uVar10 = uVar31._4_4_;
                  if (uVar28 == copyRegions.
                                super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_ - 1) {
                    uVar10 = uVar23;
                  }
                  imageMipTailMemoryBind.resourceOffset = CONCAT44(mipLevel,dVar15);
                  imageMipTailMemoryBind.size = CONCAT44(iVar26,(int)uVar25);
                  imageMipTailMemoryBind.memory.m_internal._4_4_ = uVar27 * uVar3;
                  imageMipTailMemoryBind.memory.m_internal._0_4_ = uVar28 * uVar31._4_4_;
                  uVar11 = uVar3;
                  if (uVar27 == (uint)copyRegions.
                                      super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - 1) {
                    uVar11 = uVar24;
                  }
                  imageMipTailMemoryBind.memoryOffset = CONCAT44(uVar10,iVar19);
                  imageMipTailMemoryBind.flags = uVar11;
                  std::
                  vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                  ::push_back(&imageResidencyMemoryBinds,(value_type *)&imageMipTailMemoryBind);
                  de::SharedPtr<vk::Allocation>::release((SharedPtr<vk::Allocation> *)&cmdBuffer);
                  uVar30 = uVar30 + 1;
                  iVar26 = iVar26 + (undefined4)uVar31;
                }
              }
            }
          }
          if ((fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface ==
               (DeviceInterface *)
               fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal) ||
             ((uVar1 & 1) == 0)) {
            cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
                 (DeviceInterface *)submitInfo.pNext;
            cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
                 (VkDevice)
                 CONCAT44(cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                          m_device._4_4_,submitInfo.waitSemaphoreCount);
            cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = VVar4;
            (*this->m_memAlloc->_vptr_Allocator[3])
                      (&imageMipTailMemoryBind,this->m_memAlloc,&cmdPool,0);
            VVar12 = imageMipTailMemoryBind.resourceOffset;
            imageMipTailMemoryBind.resourceOffset = 0;
            de::SharedPtr<vk::Allocation>::SharedPtr
                      ((SharedPtr<vk::Allocation> *)&cmdBuffer,(Allocation *)VVar12);
            de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
            ~UniqueBase((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                        &imageMipTailMemoryBind);
            imageMipTailMemoryBind.resourceOffset = VVar6 * uVar25 + VVar5;
            imageMipTailMemoryBind.memory.m_internal =
                 *(deUint64 *)(cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + 8);
            imageMipTailMemoryBind.memoryOffset =
                 *(VkDeviceSize *)
                  (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + 0x10);
            imageMipTailMemoryBind._32_8_ = imageMipTailMemoryBind._32_8_ & 0xffffffff00000000;
            imageMipTailMemoryBind.size = VVar4;
            std::
            vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
            push_back(&this->m_allocations,(SharedPtr<vk::Allocation> *)&cmdBuffer);
            std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::push_back
                      ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                       &fence,&imageMipTailMemoryBind);
            de::SharedPtr<vk::Allocation>::release((SharedPtr<vk::Allocation> *)&cmdBuffer);
          }
        }
        imageMipTailMemoryBind.size = 0;
        imageMipTailMemoryBind.flags = 0;
        imageMipTailMemoryBind._36_4_ = 0;
        imageMipTailMemoryBind.memory.m_internal = 0;
        imageMipTailMemoryBind.memoryOffset = 0;
        imageMipTailMemoryBind.resourceOffset = 7;
        if ((long)imageResidencyMemoryBinds.
                  super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)imageResidencyMemoryBinds.
                  super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
               sparseImage.m_internal;
          cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)
               CONCAT44(cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                        m_deviceIface._4_4_,
                        (int)((ulong)((long)imageResidencyMemoryBinds.
                                            super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)imageResidencyMemoryBinds.
                                           super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 6));
          cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
               (VkDevice)
               imageResidencyMemoryBinds.
               super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        if ((long)fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface -
            fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0) {
          cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
               (VkCommandBuffer_s *)sparseImage.m_internal;
          cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)
               CONCAT44(cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                        m_deviceIface._4_4_,
                        (int)((long)((long)fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.
                                           m_data.deleter.m_deviceIface -
                                    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.
                                    object.m_internal) / 0x28));
          cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
               (VkDevice)
               fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
        }
        VVar20 = (*vk->_vptr_DeviceInterface[0x11])(vk,pVVar21,1,&imageMipTailMemoryBind,0);
        ::vk::checkResult(VVar20,"vk.queueBindSparse(queue, 1u, &bindSparseInfo, DE_NULL)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                          ,0x661);
        std::_Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::
        ~_Vector_base((_Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                       *)&fence);
        std::_Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
        ::~_Vector_base(&imageResidencyMemoryBinds.
                         super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                       );
        std::
        _Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
        ::~_Vector_base((_Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
                         *)&bufferParams);
        std::
        _Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
        ::~_Vector_base(&sparseImageMemoryRequirements.
                         super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                       );
        cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
        cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0;
        cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
        cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = (VkCommandBuffer_s *)0x0;
        cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        ::vk::createCommandPool
                  ((Move<vk::Handle<(vk::HandleType)24>_> *)&sparseImageMemoryRequirements,vk,device
                   ,1,dVar14,(VkAllocationCallbacks *)0x0);
        imageMipTailMemoryBind.memory.m_internal =
             (deUint64)
             sparseImageMemoryRequirements.
             super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        imageMipTailMemoryBind.memoryOffset = VStack_750.m_internal;
        imageMipTailMemoryBind.resourceOffset =
             (VkDeviceSize)
             sparseImageMemoryRequirements.
             super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
             ._M_impl.super__Vector_impl_data._M_start;
        imageMipTailMemoryBind.size =
             (VkDeviceSize)
             sparseImageMemoryRequirements.
             super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        sparseImageMemoryRequirements.
        super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sparseImageMemoryRequirements.
        super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sparseImageMemoryRequirements.
        super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
                  (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>);
        cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
             (VkDevice)imageMipTailMemoryBind.memory.m_internal;
        cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)imageMipTailMemoryBind.memoryOffset;
        cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
             imageMipTailMemoryBind.resourceOffset;
        cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)imageMipTailMemoryBind.size;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&sparseImageMemoryRequirements);
        ::vk::allocateCommandBuffer
                  ((Move<vk::VkCommandBuffer_s_*> *)&sparseImageMemoryRequirements,vk,device,
                   (VkCommandPool)
                   cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
                   VK_COMMAND_BUFFER_LEVEL_PRIMARY);
        imageMipTailMemoryBind.memory.m_internal =
             (deUint64)
             sparseImageMemoryRequirements.
             super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        imageMipTailMemoryBind.memoryOffset = 0;
        imageMipTailMemoryBind.resourceOffset =
             (VkDeviceSize)
             sparseImageMemoryRequirements.
             super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
             ._M_impl.super__Vector_impl_data._M_start;
        imageMipTailMemoryBind.size =
             (VkDeviceSize)
             sparseImageMemoryRequirements.
             super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        sparseImageMemoryRequirements.
        super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sparseImageMemoryRequirements.
        super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sparseImageMemoryRequirements.
        super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset
                  (&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>);
        cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
             (VkDevice)imageMipTailMemoryBind.memory.m_internal;
        cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
             imageMipTailMemoryBind.memoryOffset;
        cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
             (VkCommandBuffer_s *)imageMipTailMemoryBind.resourceOffset;
        cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)imageMipTailMemoryBind.size;
        ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
                  ((RefBase<vk::VkCommandBuffer_s_*> *)&sparseImageMemoryRequirements);
        bufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
        bufferParams.pNext = (void *)0x0;
        bufferParams.flags = 0;
        bufferParams.size = (VkDeviceSize)dVar17;
        bufferParams.usage = 1;
        bufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        bufferParams.queueFamilyIndexCount = 0;
        bufferParams.pQueueFamilyIndices = (deUint32 *)0x0;
        ::vk::createBuffer(&buffer,vk,device,&bufferParams,(VkAllocationCallbacks *)0x0);
        pAVar7 = this->m_memAlloc;
        ::vk::getBufferMemoryRequirements
                  ((VkMemoryRequirements *)&imageMipTailMemoryBind,vk,device,
                   (VkBuffer)
                   buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
        (*pAVar7->_vptr_Allocator[3])(&bufferAlloc,pAVar7,&imageMipTailMemoryBind,1);
        VVar20 = (*vk->_vptr_DeviceInterface[0xc])
                           (vk,device,
                            buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                            m_internal,
                            *(undefined8 *)
                             (CONCAT44(bufferAlloc.
                                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                       .m_data.ptr._4_4_,
                                       (uint)bufferAlloc.
                                             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                             .m_data.ptr) + 8),
                            *(undefined8 *)
                             (CONCAT44(bufferAlloc.
                                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                       .m_data.ptr._4_4_,
                                       (uint)bufferAlloc.
                                             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                             .m_data.ptr) + 0x10));
        ::vk::checkResult(VVar20,
                          "vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                          ,0x67c);
        imageResidencyMemoryBinds.
        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(imageResidencyMemoryBinds.
                               super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2c);
        imageResidencyMemoryBinds.
        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        imageResidencyMemoryBinds.
        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x80000004000;
        imageMipTailMemoryBind.resourceOffset =
             CONCAT44(imageMipTailMemoryBind.resourceOffset._4_4_,0x2d);
        imageMipTailMemoryBind.size = 0;
        imageMipTailMemoryBind.memory.m_internal = 0x100000000000;
        imageMipTailMemoryBind.memoryOffset = 0x700000000;
        imageMipTailMemoryBind.flags = 0xffffffff;
        imageMipTailMemoryBind._36_4_ = 0xffffffff;
        sparseImageMemoryRequirements.
        super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(sparseImageMemoryRequirements.
                               super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2d);
        sparseImageMemoryRequirements.
        super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sparseImageMemoryRequirements.
        super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2000001000;
        cmdBufferBeginInfo.flags = 1;
        cmdBufferBeginInfo._20_4_ = 0;
        cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
        cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
        cmdBufferBeginInfo._4_4_ = 0;
        cmdBufferBeginInfo.pNext._0_4_ = 0;
        cmdBufferBeginInfo.pNext._4_4_ = 0;
        copyRegions.
        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        copyRegions.
        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        copyRegions.
        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar8 = *(long *)(CONCAT44(bufferAlloc.
                                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                   .m_data.ptr._4_4_,
                                   (uint)bufferAlloc.
                                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                         .m_data.ptr) + 0x18);
        dVar14 = 0;
        for (uVar31 = 0;
            pvVar29 = (textureData->
                      super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
            uVar31 < (ulong)(((long)(textureData->
                                    super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar29) /
                            0x18); uVar31 = uVar31 + 1) {
          pvVar29 = pvVar29 + uVar31;
          lVar32 = 8;
          for (uVar25 = 0;
              lVar9 = *(long *)&(pvVar29->
                                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                )._M_impl.super__Vector_impl_data,
              uVar25 < (ulong)(((long)(pvVar29->
                                      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - lVar9) / 0x28);
              uVar25 = uVar25 + 1) {
            dVar14 = sr::anon_unknown_0::getNextMultiple(&offsetMultiples,dVar14);
            format = (TextureFormat *)(lVar9 + lVar32 + -8);
            tcu::PixelBufferAccess::PixelBufferAccess
                      ((PixelBufferAccess *)&fence,format,(IVec3 *)(lVar9 + lVar32),
                       (void *)(lVar8 + (ulong)dVar14));
            submitInfo.pNext =
                 (void *)CONCAT44(*(undefined4 *)(lVar9 + 4 + lVar32),
                                  *(undefined4 *)(lVar9 + lVar32));
            submitInfo._20_4_ = SUB84(uVar31,0);
            submitInfo.pWaitSemaphores._0_4_ = (undefined4)uVar25;
            submitInfo.pWaitSemaphores._4_4_ = 1;
            submitInfo.pWaitDstStageMask._0_4_ = 0;
            submitInfo.pWaitDstStageMask._4_4_ = 0;
            submitInfo.commandBufferCount = 0;
            submitInfo._44_4_ = *(undefined4 *)(lVar9 + lVar32);
            submitInfo.pCommandBuffers =
                 (VkCommandBuffer *)
                 CONCAT44(*(undefined4 *)(lVar9 + 8 + lVar32),*(undefined4 *)(lVar9 + 4 + lVar32));
            submitInfo._0_8_ = (ulong)dVar14;
            submitInfo.waitSemaphoreCount = dVar15;
            std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::push_back
                      (&copyRegions,(value_type *)&submitInfo);
            tcu::copy((EVP_PKEY_CTX *)&fence,(EVP_PKEY_CTX *)format);
            iVar16 = *(int *)(lVar9 + lVar32);
            iVar26 = *(int *)(lVar9 + 4 + lVar32);
            iVar19 = *(int *)(lVar9 + 8 + lVar32);
            iVar18 = tcu::TextureFormat::getPixelSize(format);
            dVar14 = iVar19 * iVar18 * iVar26 * iVar16 + dVar14;
            lVar32 = lVar32 + 0x28;
          }
        }
        VVar20 = (*vk->_vptr_DeviceInterface[0x49])
                           (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                            &cmdBufferBeginInfo);
        ::vk::checkResult(VVar20,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                          ,0x6e9);
        (*vk->_vptr_DeviceInterface[0x6d])
                  (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x4000,0x1000,0
                   ,0,0,1,&imageResidencyMemoryBinds,1,&imageMipTailMemoryBind);
        (*vk->_vptr_DeviceInterface[0x62])
                  (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                   buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                   sparseImage.m_internal,7,
                   ((long)copyRegions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)copyRegions.
                         super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,
                   copyRegions.
                   super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        (*vk->_vptr_DeviceInterface[0x6d])
                  (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x1000,1,0,0,0,
                   0,0,1,&sparseImageMemoryRequirements);
        VVar20 = (*vk->_vptr_DeviceInterface[0x4a])
                           (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
        ::vk::checkResult(VVar20,"vk.endCommandBuffer(*cmdBuffer)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                          ,0x6ed);
        submitInfo.pWaitDstStageMask = &pipelineStageFlags;
        submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
        submitInfo.pNext = (void *)0x0;
        submitInfo.pWaitSemaphores = (VkSemaphore *)&local_5c8;
        submitInfo.pCommandBuffers = (VkCommandBuffer *)&cmdBuffer;
        submitInfo.signalSemaphoreCount = 0;
        pipelineStageFlags = 0x8000;
        submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
        submitInfo.waitSemaphoreCount = 1;
        submitInfo.commandBufferCount = 1;
        ::vk::createFence(&fence,vk,device,0,(VkAllocationCallbacks *)0x0);
        VVar20 = (*vk->_vptr_DeviceInterface[2])
                           (vk,pVVar21,1,&submitInfo,
                            fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                            m_internal);
        ::vk::checkResult(VVar20,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                          ,0x702);
        VVar20 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&fence,1,0xffffffffffffffff);
        ::vk::checkResult(VVar20,"vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                          ,0x703);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
                  (&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>);
        std::_Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::
        ~_Vector_base(&copyRegions.
                       super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                     );
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  (&bufferAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                  (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
        ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
                  (&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                  (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
        ;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_5c8);
        return;
      }
      pNVar22 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar22,"Required memory size for sparse resource exceeds device limits.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                 ,0x5d5);
      goto LAB_00635600;
    }
    uVar31 = uVar31 + 1;
  } while( true );
}

Assistant:

void ShaderRenderCaseInstance::uploadSparseImage (const tcu::TextureFormat&		texFormat,
												  const TextureData&			textureData,
												  const tcu::Sampler&			refSampler,
												  const deUint32				mipLevels,
												  const deUint32				arrayLayers,
												  const VkImage					sparseImage,
												  const VkImageCreateInfo&		imageCreateInfo,
												  const tcu::UVec3				texSize)
{
	const VkDevice							vkDevice				= getDevice();
	const DeviceInterface&					vk						= getDeviceInterface();
	const VkPhysicalDevice					physicalDevice			= getPhysicalDevice();
	const VkQueue							queue					= getUniversalQueue();
	const deUint32							queueFamilyIndex		= getUniversalQueueFamilyIndex();
	const InstanceInterface&				instance				= getInstanceInterface();
	const VkPhysicalDeviceProperties		deviceProperties		= getPhysicalDeviceProperties(instance, physicalDevice);
	const VkPhysicalDeviceMemoryProperties	deviceMemoryProperties	= getPhysicalDeviceMemoryProperties(instance, physicalDevice);
	const bool								isShadowSampler			= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags				aspectMask				= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;

	const Unique<VkSemaphore>				imageMemoryBindSemaphore(createSemaphore(vk, vkDevice));
	deUint32								bufferSize				= 0u;
	std::vector<deUint32>					offsetMultiples;
	offsetMultiples.push_back(4u);
	offsetMultiples.push_back(texFormat.getPixelSize());

	if (isImageSizeSupported(imageCreateInfo.imageType, texSize, deviceProperties.limits) == false)
		TCU_THROW(NotSupportedError, "Image size not supported for device.");

	// Calculate buffer size
	for (TextureData::const_iterator mit = textureData.begin(); mit != textureData.end(); ++mit)
	{
		for (TextureLayerData::const_iterator lit = mit->begin(); lit != mit->end(); ++lit)
		{
			const tcu::ConstPixelBufferAccess&	access	= *lit;

			bufferSize = getNextMultiple(offsetMultiples, bufferSize);
			bufferSize += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
		}
	}

	{
		deUint32 sparseMemoryReqCount = 0;

		vk.getImageSparseMemoryRequirements(vkDevice, sparseImage, &sparseMemoryReqCount, DE_NULL);

		DE_ASSERT(sparseMemoryReqCount != 0);

		std::vector<VkSparseImageMemoryRequirements> sparseImageMemoryRequirements;
		sparseImageMemoryRequirements.resize(sparseMemoryReqCount);

		vk.getImageSparseMemoryRequirements(vkDevice, sparseImage, &sparseMemoryReqCount, &sparseImageMemoryRequirements[0]);

		const deUint32 noMatchFound = ~((deUint32)0);

		deUint32 colorAspectIndex = noMatchFound;
		for (deUint32 memoryReqNdx = 0; memoryReqNdx < sparseMemoryReqCount; ++memoryReqNdx)
		{
			if (sparseImageMemoryRequirements[memoryReqNdx].formatProperties.aspectMask & VK_IMAGE_ASPECT_COLOR_BIT)
			{
				colorAspectIndex = memoryReqNdx;
				break;
			}
		}

		if (colorAspectIndex == noMatchFound)
			TCU_THROW(NotSupportedError, "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT.");

		const VkMemoryRequirements	memoryRequirements	= getImageMemoryRequirements(vk, vkDevice, sparseImage);

		deUint32 memoryType = noMatchFound;
		for (deUint32 memoryTypeNdx = 0; memoryTypeNdx < deviceMemoryProperties.memoryTypeCount; ++memoryTypeNdx)
		{
			if ((memoryRequirements.memoryTypeBits & (1u << memoryTypeNdx)) != 0 &&
				MemoryRequirement::Any.matchesHeap(deviceMemoryProperties.memoryTypes[memoryTypeNdx].propertyFlags))
			{
				memoryType = memoryTypeNdx;
				break;
			}
		}

		if (memoryType == noMatchFound)
			TCU_THROW(NotSupportedError, "No matching memory type found.");

		if (memoryRequirements.size > deviceProperties.limits.sparseAddressSpaceSize)
			TCU_THROW(NotSupportedError, "Required memory size for sparse resource exceeds device limits.");

		// Check if the image format supports sparse oprerations
		const std::vector<VkSparseImageFormatProperties> sparseImageFormatPropVec =
			getPhysicalDeviceSparseImageFormatProperties(instance, physicalDevice, imageCreateInfo.format, imageCreateInfo.imageType, imageCreateInfo.samples, imageCreateInfo.usage, imageCreateInfo.tiling);

		if (sparseImageFormatPropVec.size() == 0)
			TCU_THROW(NotSupportedError, "The image format does not support sparse operations.");

		const VkSparseImageMemoryRequirements		aspectRequirements	= sparseImageMemoryRequirements[colorAspectIndex];
		const VkExtent3D							imageGranularity	= aspectRequirements.formatProperties.imageGranularity;

		std::vector<VkSparseImageMemoryBind>		imageResidencyMemoryBinds;
		std::vector<VkSparseMemoryBind>				imageMipTailMemoryBinds;

		for (deUint32 layerNdx = 0; layerNdx < arrayLayers; ++ layerNdx)
		{
			for (deUint32 mipLevelNdx = 0; mipLevelNdx < aspectRequirements.imageMipTailFirstLod; ++mipLevelNdx)
			{
				const VkExtent3D	mipExtent		= mipLevelExtents(imageCreateInfo.extent, mipLevelNdx);
				const tcu::UVec3	numSparseBinds	= alignedDivide(mipExtent, imageGranularity);
				const tcu::UVec3	lastBlockExtent	= tcu::UVec3(mipExtent.width  % imageGranularity.width  ? mipExtent.width  % imageGranularity.width  : imageGranularity.width,
																 mipExtent.height % imageGranularity.height ? mipExtent.height % imageGranularity.height : imageGranularity.height,
																 mipExtent.depth  % imageGranularity.depth  ? mipExtent.depth  % imageGranularity.depth  : imageGranularity.depth );

				for (deUint32 z = 0; z < numSparseBinds.z(); ++z)
				for (deUint32 y = 0; y < numSparseBinds.y(); ++y)
				for (deUint32 x = 0; x < numSparseBinds.x(); ++x)
				{
					const VkMemoryRequirements allocRequirements =
					{
						// 28.7.5 alignment shows the block size in bytes
						memoryRequirements.alignment,		// VkDeviceSize	size;
						memoryRequirements.alignment,		// VkDeviceSize	alignment;
						memoryRequirements.memoryTypeBits,	// uint32_t		memoryTypeBits;
					};

					de::SharedPtr<Allocation> allocation(m_memAlloc.allocate(allocRequirements, MemoryRequirement::Any).release());

					m_allocations.push_back(allocation);

					VkOffset3D offset;
					offset.x = x*imageGranularity.width;
					offset.y = y*imageGranularity.height;
					offset.z = z*imageGranularity.depth;

					VkExtent3D extent;
					extent.width	= (x == numSparseBinds.x() - 1) ? lastBlockExtent.x() : imageGranularity.width;
					extent.height	= (y == numSparseBinds.y() - 1) ? lastBlockExtent.y() : imageGranularity.height;
					extent.depth	= (z == numSparseBinds.z() - 1) ? lastBlockExtent.z() : imageGranularity.depth;

					const VkSparseImageMemoryBind imageMemoryBind =
					{
						{
							aspectMask,	// VkImageAspectFlags	aspectMask;
							mipLevelNdx,// uint32_t				mipLevel;
							layerNdx,	// uint32_t				arrayLayer;
						},							// VkImageSubresource		subresource;
						offset,						// VkOffset3D				offset;
						extent,						// VkExtent3D				extent;
						allocation->getMemory(),	// VkDeviceMemory			memory;
						allocation->getOffset(),	// VkDeviceSize				memoryOffset;
						0u,							// VkSparseMemoryBindFlags	flags;
					};

					imageResidencyMemoryBinds.push_back(imageMemoryBind);
				}
			}

			// Handle MIP tail. There are two cases to consider here:
			//
			// 1) VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT is requested by the driver: each layer needs a separate tail.
			// 2) otherwise:                                                            only one tail is needed.
			{
				if ( imageMipTailMemoryBinds.size() == 0                                                                                                   ||
					(imageMipTailMemoryBinds.size() != 0 && (aspectRequirements.formatProperties.flags & VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT) == 0))
				{
					const VkMemoryRequirements allocRequirements =
					{
						aspectRequirements.imageMipTailSize,	// VkDeviceSize	size;
						memoryRequirements.alignment,			// VkDeviceSize	alignment;
						memoryRequirements.memoryTypeBits,		// uint32_t		memoryTypeBits;
					};

					const de::SharedPtr<Allocation> allocation(m_memAlloc.allocate(allocRequirements, MemoryRequirement::Any).release());

					const VkSparseMemoryBind imageMipTailMemoryBind =
					{
						aspectRequirements.imageMipTailOffset + layerNdx * aspectRequirements.imageMipTailStride,	// VkDeviceSize					resourceOffset;
						aspectRequirements.imageMipTailSize,														// VkDeviceSize					size;
						allocation->getMemory(),																	// VkDeviceMemory				memory;
						allocation->getOffset(),																	// VkDeviceSize					memoryOffset;
						0u,																							// VkSparseMemoryBindFlags		flags;
					};

					m_allocations.push_back(allocation);
					imageMipTailMemoryBinds.push_back(imageMipTailMemoryBind);
				}
			}
		}

		VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			0u,											//deUint32									bufferBindCount;
			DE_NULL,									//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			0u,											//deUint32									imageOpaqueBindCount;
			DE_NULL,									//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&imageMemoryBindSemaphore.get()				//const VkSemaphore*						pSignalSemaphores;
		};

		VkSparseImageMemoryBindInfo			imageResidencyBindInfo;
		VkSparseImageOpaqueMemoryBindInfo	imageMipTailBindInfo;

		if (imageResidencyMemoryBinds.size() > 0)
		{
			imageResidencyBindInfo.image		= sparseImage;
			imageResidencyBindInfo.bindCount	= static_cast<deUint32>(imageResidencyMemoryBinds.size());
			imageResidencyBindInfo.pBinds		= &imageResidencyMemoryBinds[0];

			bindSparseInfo.imageBindCount		= 1u;
			bindSparseInfo.pImageBinds			= &imageResidencyBindInfo;
		}

		if (imageMipTailMemoryBinds.size() > 0)
		{
			imageMipTailBindInfo.image = sparseImage;
			imageMipTailBindInfo.bindCount = static_cast<deUint32>(imageMipTailMemoryBinds.size());
			imageMipTailBindInfo.pBinds = &imageMipTailMemoryBinds[0];

			bindSparseInfo.imageOpaqueBindCount = 1u;
			bindSparseInfo.pImageOpaqueBinds = &imageMipTailBindInfo;
		}

		VK_CHECK(vk.queueBindSparse(queue, 1u, &bindSparseInfo, DE_NULL));
	}

	Move<VkCommandPool>		cmdPool;
	Move<VkCommandBuffer>	cmdBuffer;

	// Create command pool
	cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);

	// Create command buffer
	cmdBuffer = allocateCommandBuffer(vk, vkDevice, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create source buffer
	const VkBufferCreateInfo bufferParams =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
		DE_NULL,									// const void*			pNext;
		0u,											// VkBufferCreateFlags	flags;
		bufferSize,									// VkDeviceSize			size;
		VK_BUFFER_USAGE_TRANSFER_SRC_BIT,			// VkBufferUsageFlags	usage;
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
		0u,											// deUint32				queueFamilyIndexCount;
		DE_NULL,									// const deUint32*		pQueueFamilyIndices;
	};

	Move<VkBuffer>					buffer		= createBuffer(vk, vkDevice, &bufferParams);
	de::MovePtr<Allocation>			bufferAlloc = m_memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
	VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));

	// Barriers for copying buffer to image
	const VkBufferMemoryBarrier preBufferBarrier =
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_HOST_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			dstQueueFamilyIndex;
		*buffer,									// VkBuffer			buffer;
		0u,											// VkDeviceSize		offset;
		bufferSize									// VkDeviceSize		size;
	};

	const VkImageMemoryBarrier preImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		sparseImage,									// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkImageMemoryBarrier postImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_SHADER_READ_BIT,						// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		sparseImage,									// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	std::vector<VkBufferImageCopy>	copyRegions;
	// Get copy regions and write buffer data
	{
		deUint32	layerDataOffset		= 0;
		deUint8*	destPtr				= (deUint8*)bufferAlloc->getHostPtr();

		for (size_t levelNdx = 0; levelNdx < textureData.size(); levelNdx++)
		{
			const TextureLayerData&		layerData	= textureData[levelNdx];

			for (size_t layerNdx = 0; layerNdx < layerData.size(); layerNdx++)
			{
				layerDataOffset = getNextMultiple(offsetMultiples, layerDataOffset);

				const tcu::ConstPixelBufferAccess&	access		= layerData[layerNdx];
				const tcu::PixelBufferAccess		destAccess	(access.getFormat(), access.getSize(), destPtr + layerDataOffset);

				const VkBufferImageCopy				layerRegion =
				{
					layerDataOffset,						// VkDeviceSize				bufferOffset;
					(deUint32)access.getWidth(),			// deUint32					bufferRowLength;
					(deUint32)access.getHeight(),			// deUint32					bufferImageHeight;
					{										// VkImageSubresourceLayers	imageSubresource;
						aspectMask,								// VkImageAspectFlags		aspectMask;
						(deUint32)levelNdx,						// uint32_t					mipLevel;
						(deUint32)layerNdx,						// uint32_t					baseArrayLayer;
						1u										// uint32_t					layerCount;
					},
					{ 0u, 0u, 0u },							// VkOffset3D			imageOffset;
					{										// VkExtent3D			imageExtent;
						(deUint32)access.getWidth(),
						(deUint32)access.getHeight(),
						(deUint32)access.getDepth()
					}
				};

				copyRegions.push_back(layerRegion);
				tcu::copy(destAccess, access);

				layerDataOffset += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
			}
		}
	}

	// Copy buffer to image
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &preBufferBarrier, 1, &preImageBarrier);
	vk.cmdCopyBufferToImage(*cmdBuffer, *buffer, sparseImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, (deUint32)copyRegions.size(), copyRegions.data());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	const VkPipelineStageFlags pipelineStageFlags = VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT;

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType				sType;
		DE_NULL,								// const void*					pNext;
		1u,										// deUint32						waitSemaphoreCount;
		&imageMemoryBindSemaphore.get(),		// const VkSemaphore*			pWaitSemaphores;
		&pipelineStageFlags,					// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,										// deUint32						commandBufferCount;
		&cmdBuffer.get(),						// const VkCommandBuffer*		pCommandBuffers;
		0u,										// deUint32						signalSemaphoreCount;
		DE_NULL									// const VkSemaphore*			pSignalSemaphores;
	};

	Move<VkFence>	fence = createFence(vk, vkDevice);

	try
	{
		VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *fence));
		VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) /* infinity */));
	}
	catch (...)
	{
		VK_CHECK(vk.deviceWaitIdle(vkDevice));
		throw;
	}
}